

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_raw.c
# Opt level: O1

int archive_read_support_format_raw(archive *_a)

{
  int iVar1;
  int iVar2;
  void *format_data;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_raw");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    format_data = calloc(1,0x18);
    if (format_data == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate raw_info data");
    }
    else {
      iVar2 = __archive_read_register_format
                        ((archive_read *)_a,format_data,"raw",archive_read_format_raw_bid,
                         (_func_int_archive_read_ptr_char_ptr_char_ptr *)0x0,
                         archive_read_format_raw_read_header,archive_read_format_raw_read_data,
                         archive_read_format_raw_read_data_skip,
                         (_func_int64_t_archive_read_ptr_int64_t_int *)0x0,
                         archive_read_format_raw_cleanup,(_func_int_archive_read_ptr *)0x0,
                         (_func_int_archive_read_ptr *)0x0);
      if (iVar2 != 0) {
        free(format_data);
      }
    }
  }
  return iVar2;
}

Assistant:

int
archive_read_support_format_raw(struct archive *_a)
{
	struct raw_info *info;
	struct archive_read *a = (struct archive_read *)_a;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_raw");

	info = (struct raw_info *)calloc(1, sizeof(*info));
	if (info == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate raw_info data");
		return (ARCHIVE_FATAL);
	}

	r = __archive_read_register_format(a,
	    info,
	    "raw",
	    archive_read_format_raw_bid,
	    NULL,
	    archive_read_format_raw_read_header,
	    archive_read_format_raw_read_data,
	    archive_read_format_raw_read_data_skip,
	    NULL,
	    archive_read_format_raw_cleanup,
	    NULL,
	    NULL);
	if (r != ARCHIVE_OK)
		free(info);
	return (r);
}